

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::addResolveImageWholeCopyBeforeResolvingTests(TestCaseGroup *group)

{
  anon_union_4_2_42ec4cd4_for_TestParams_4 aVar1;
  TestContext *testCtx;
  ResolveImageToImageTestCase *this;
  long lVar2;
  VkSampleCountFlagBits sampleFlag;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  undefined1 *puVar4;
  value_type *pvVar5;
  string local_140;
  TestParams params;
  CopyRegion imageResolve;
  TestParams local_80;
  
  params.regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  params.regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  params.regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  params.src.buffer.size = (Buffer)0x2500000001;
  params.src._8_8_ = 0x4000000040;
  params.src._16_8_ = 0x600000001;
  params.dst.buffer.size = (Buffer)0x2500000001;
  params.dst._8_8_ = 0x4000000040;
  params.dst._16_8_ = 0x700000001;
  puVar4 = &DAT_00973f18;
  pvVar5 = &imageResolve;
  for (lVar2 = 0x44; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined1 *)pvVar5 = *puVar4;
    puVar4 = puVar4 + 1;
    pvVar5 = (value_type *)((long)&(pvVar5->bufferCopy).srcOffset + 1);
  }
  std::
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ::push_back(&params.regions,&imageResolve);
  uVar3 = extraout_RDX;
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    aVar1 = *(anon_union_4_2_42ec4cd4_for_TestParams_4 *)
             ((long)&api::(anonymous_namespace)::samples + lVar2);
    params.field_3 = aVar1;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              (&local_140,(_anonymous_namespace_ *)(ulong)aVar1.filter,(VkSampleCountFlagBits)uVar3)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &imageResolve.bufferCopy,"With ",&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    this = (ResolveImageToImageTestCase *)operator_new(200);
    testCtx = (group->super_TestNode).m_testCtx;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              (&local_140,(_anonymous_namespace_ *)(ulong)aVar1.filter,sampleFlag);
    TestParams::TestParams(&local_80,&params);
    ResolveImageToImageTestCase::ResolveImageToImageTestCase
              (this,testCtx,&local_140,(string *)&imageResolve.bufferCopy,&local_80,
               COPY_MS_IMAGE_TO_MS_IMAGE);
    tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)this);
    TestParams::~TestParams(&local_80);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&imageResolve.bufferCopy);
    uVar3 = extraout_RDX_00;
  }
  TestParams::~TestParams(&params);
  return;
}

Assistant:

void addResolveImageWholeCopyBeforeResolvingTests (tcu::TestCaseGroup* group)
{
	TestParams	params;
	params.src.image.imageType			= VK_IMAGE_TYPE_2D;
	params.src.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.src.image.extent				= defaultExtent;
	params.src.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
	params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
	params.dst.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.dst.image.extent				= defaultExtent;
	params.dst.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;

	{
		const VkImageSubresourceLayers	sourceLayer	=
		{
			VK_IMAGE_ASPECT_COLOR_BIT,	// VkImageAspectFlags	aspectMask;
			0u,							// uint32_t				mipLevel;
			0u,							// uint32_t				baseArrayLayer;
			1u							// uint32_t				layerCount;
		};

		const VkImageResolve			testResolve	=
		{
			sourceLayer,		// VkImageSubresourceLayers	srcSubresource;
			{0, 0, 0},			// VkOffset3D				srcOffset;
			sourceLayer,		// VkImageSubresourceLayers	dstSubresource;
			{0, 0, 0},			// VkOffset3D				dstOffset;
			defaultExtent,		// VkExtent3D				extent;
		};

		CopyRegion	imageResolve;
		imageResolve.imageResolve	= testResolve;
		params.regions.push_back(imageResolve);
	}

	for (int samplesIndex = 0; samplesIndex < DE_LENGTH_OF_ARRAY(samples); ++samplesIndex)
	{
		params.samples					= samples[samplesIndex];
		const std::string description	= "With " + getSampleCountCaseName(samples[samplesIndex]);
		group->addChild(new ResolveImageToImageTestCase(group->getTestContext(), getSampleCountCaseName(samples[samplesIndex]), description, params, COPY_MS_IMAGE_TO_MS_IMAGE));
	}
}